

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

OPJ_BOOL opj_t1_allocate_buffers(opj_t1_t *t1,OPJ_UINT32 w,OPJ_UINT32 h)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  OPJ_INT32 *pOVar4;
  opj_flag_t *poVar5;
  opj_flag_t local_44;
  OPJ_UINT32 v;
  OPJ_UINT32 flags_height;
  OPJ_UINT32 x;
  opj_flag_t *p;
  OPJ_UINT32 datasize;
  OPJ_UINT32 flags_stride;
  OPJ_UINT32 flagssize;
  OPJ_UINT32 h_local;
  OPJ_UINT32 w_local;
  opj_t1_t *t1_local;
  
  if (0x400 < w) {
    __assert_fail("w <= 1024",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/t1.c"
                  ,0x5b2,"OPJ_BOOL opj_t1_allocate_buffers(opj_t1_t *, OPJ_UINT32, OPJ_UINT32)");
  }
  if (h < 0x401) {
    if (0x1000 < w * h) {
      __assert_fail("w * h <= 4096",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/t1.c"
                    ,0x5b4,"OPJ_BOOL opj_t1_allocate_buffers(opj_t1_t *, OPJ_UINT32, OPJ_UINT32)");
    }
    uVar1 = w * h;
    if (t1->datasize < uVar1) {
      opj_aligned_free(t1->data);
      pOVar4 = (OPJ_INT32 *)opj_aligned_malloc((ulong)uVar1 << 2);
      t1->data = pOVar4;
      if (t1->data == (OPJ_INT32 *)0x0) {
        return 0;
      }
      t1->datasize = uVar1;
    }
    if (t1->data != (OPJ_INT32 *)0x0) {
      memset(t1->data,0,(ulong)uVar1 << 2);
    }
    uVar1 = w + 2;
    uVar2 = uVar1 * ((h + 3 >> 2) + 2);
    uVar3 = h + 3 >> 2;
    if (t1->flagssize < uVar2) {
      opj_aligned_free(t1->flags);
      poVar5 = (opj_flag_t *)opj_aligned_malloc((ulong)uVar2 << 2);
      t1->flags = poVar5;
      if (t1->flags == (opj_flag_t *)0x0) {
        return 0;
      }
    }
    t1->flagssize = uVar2;
    memset(t1->flags,0,(ulong)uVar2 << 2);
    _flags_height = t1->flags;
    for (v = 0; v < uVar1; v = v + 1) {
      *_flags_height = 0x49200000;
      _flags_height = _flags_height + 1;
    }
    _flags_height = t1->flags + (uVar3 + 1) * uVar1;
    for (v = 0; v < uVar1; v = v + 1) {
      *_flags_height = 0x49200000;
      _flags_height = _flags_height + 1;
    }
    if ((h & 3) != 0) {
      local_44 = 0;
      if ((h & 3) == 1) {
        local_44 = 0x49000000;
      }
      else if ((h & 3) == 2) {
        local_44 = 0x48000000;
      }
      else if ((h & 3) == 3) {
        local_44 = 0x40000000;
      }
      _flags_height = t1->flags + uVar3 * uVar1;
      for (v = 0; v < uVar1; v = v + 1) {
        *_flags_height = local_44;
        _flags_height = _flags_height + 1;
      }
    }
    t1->w = w;
    t1->h = h;
    return 1;
  }
  __assert_fail("h <= 1024",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/t1.c"
                ,0x5b3,"OPJ_BOOL opj_t1_allocate_buffers(opj_t1_t *, OPJ_UINT32, OPJ_UINT32)");
}

Assistant:

static OPJ_BOOL opj_t1_allocate_buffers(
    opj_t1_t *t1,
    OPJ_UINT32 w,
    OPJ_UINT32 h)
{
    OPJ_UINT32 flagssize;
    OPJ_UINT32 flags_stride;

    /* No risk of overflow. Prior checks ensure those assert are met */
    /* They are per the specification */
    assert(w <= 1024);
    assert(h <= 1024);
    assert(w * h <= 4096);

    /* encoder uses tile buffer, so no need to allocate */
    {
        OPJ_UINT32 datasize = w * h;

        if (datasize > t1->datasize) {
            opj_aligned_free(t1->data);
            t1->data = (OPJ_INT32*) opj_aligned_malloc(datasize * sizeof(OPJ_INT32));
            if (!t1->data) {
                /* FIXME event manager error callback */
                return OPJ_FALSE;
            }
            t1->datasize = datasize;
        }
        /* memset first arg is declared to never be null by gcc */
        if (t1->data != NULL) {
            memset(t1->data, 0, datasize * sizeof(OPJ_INT32));
        }
    }

    flags_stride = w + 2U; /* can't be 0U */

    flagssize = (h + 3U) / 4U + 2U;

    flagssize *= flags_stride;
    {
        opj_flag_t* p;
        OPJ_UINT32 x;
        OPJ_UINT32 flags_height = (h + 3U) / 4U;

        if (flagssize > t1->flagssize) {

            opj_aligned_free(t1->flags);
            t1->flags = (opj_flag_t*) opj_aligned_malloc(flagssize * sizeof(
                            opj_flag_t));
            if (!t1->flags) {
                /* FIXME event manager error callback */
                return OPJ_FALSE;
            }
        }
        t1->flagssize = flagssize;

        memset(t1->flags, 0, flagssize * sizeof(opj_flag_t));

        p = &t1->flags[0];
        for (x = 0; x < flags_stride; ++x) {
            /* magic value to hopefully stop any passes being interested in this entry */
            *p++ = (T1_PI_0 | T1_PI_1 | T1_PI_2 | T1_PI_3);
        }

        p = &t1->flags[((flags_height + 1) * flags_stride)];
        for (x = 0; x < flags_stride; ++x) {
            /* magic value to hopefully stop any passes being interested in this entry */
            *p++ = (T1_PI_0 | T1_PI_1 | T1_PI_2 | T1_PI_3);
        }

        if (h % 4) {
            OPJ_UINT32 v = 0;
            p = &t1->flags[((flags_height) * flags_stride)];
            if (h % 4 == 1) {
                v |= T1_PI_1 | T1_PI_2 | T1_PI_3;
            } else if (h % 4 == 2) {
                v |= T1_PI_2 | T1_PI_3;
            } else if (h % 4 == 3) {
                v |= T1_PI_3;
            }
            for (x = 0; x < flags_stride; ++x) {
                *p++ = v;
            }
        }
    }

    t1->w = w;
    t1->h = h;

    return OPJ_TRUE;
}